

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O1

uint SOIL_load_OGL_cubemap
               (char *x_pos_file,char *x_neg_file,char *y_pos_file,char *y_neg_file,char *z_pos_file
               ,char *z_neg_file,int force_channels,uint reuse_texture_ID,uint flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  stbi_uc *psVar5;
  uint local_44;
  int local_3c;
  int local_38;
  int width;
  int height;
  int channels;
  
  if ((z_pos_file == (char *)0x0 ||
      ((y_neg_file == (char *)0x0 || y_pos_file == (char *)0x0) ||
      (x_neg_file == (char *)0x0 || x_pos_file == (char *)0x0))) || z_neg_file == (char *)0x0) {
    result_string_pointer = "Invalid cube map files list";
    return 0;
  }
  iVar1 = query_cubemap_capability();
  if (iVar1 != 1) {
    result_string_pointer = "No cube map capability present";
    return 0;
  }
  psVar5 = stbi_load(x_pos_file,&local_3c,&local_38,&width,force_channels);
  if (psVar5 == (stbi_uc *)0x0) {
    result_string_pointer = stbi_failure_reason();
  }
  else {
    result_string_pointer = "Image loaded";
  }
  uVar2 = force_channels - 1;
  if (uVar2 < 4) {
    width = force_channels;
  }
  if (psVar5 == (stbi_uc *)0x0) {
LAB_001de7e7:
    result_string_pointer = stbi_failure_reason();
    return 0;
  }
  uVar3 = SOIL_internal_create_OGL_texture
                    (psVar5,local_3c,local_38,width,reuse_texture_ID,flags,0x8513,0x8515,0x851c);
  free(psVar5);
  local_44 = 0;
  uVar4 = 0;
  if (uVar3 != 0) {
    psVar5 = stbi_load(x_neg_file,&local_3c,&local_38,&width,force_channels);
    if (psVar5 == (stbi_uc *)0x0) {
      result_string_pointer = stbi_failure_reason();
    }
    else {
      result_string_pointer = "Image loaded";
    }
    if (uVar2 < 4) {
      width = force_channels;
    }
    if (psVar5 == (stbi_uc *)0x0) goto LAB_001de7e7;
    uVar4 = SOIL_internal_create_OGL_texture
                      (psVar5,local_3c,local_38,width,uVar3,flags,0x8513,0x8516,0x851c);
    free(psVar5);
  }
  if (uVar4 != 0) {
    psVar5 = stbi_load(y_pos_file,&local_3c,&local_38,&width,force_channels);
    if (psVar5 == (stbi_uc *)0x0) {
      result_string_pointer = stbi_failure_reason();
    }
    else {
      result_string_pointer = "Image loaded";
    }
    if (uVar2 < 4) {
      width = force_channels;
    }
    if (psVar5 == (stbi_uc *)0x0) goto LAB_001de7e7;
    local_44 = SOIL_internal_create_OGL_texture
                         (psVar5,local_3c,local_38,width,uVar4,flags,0x8513,0x8517,0x851c);
    free(psVar5);
  }
  uVar4 = 0;
  uVar3 = 0;
  if (local_44 != 0) {
    psVar5 = stbi_load(y_neg_file,&local_3c,&local_38,&width,force_channels);
    if (psVar5 == (stbi_uc *)0x0) {
      result_string_pointer = stbi_failure_reason();
    }
    else {
      result_string_pointer = "Image loaded";
    }
    if (uVar2 < 4) {
      width = force_channels;
    }
    if (psVar5 == (stbi_uc *)0x0) goto LAB_001de7e7;
    uVar3 = SOIL_internal_create_OGL_texture
                      (psVar5,local_3c,local_38,width,local_44,flags,0x8513,0x8518,0x851c);
    free(psVar5);
  }
  if (uVar3 != 0) {
    psVar5 = stbi_load(z_pos_file,&local_3c,&local_38,&width,force_channels);
    if (psVar5 == (stbi_uc *)0x0) {
      result_string_pointer = stbi_failure_reason();
    }
    else {
      result_string_pointer = "Image loaded";
    }
    if (uVar2 < 4) {
      width = force_channels;
    }
    if (psVar5 == (stbi_uc *)0x0) goto LAB_001de7e7;
    uVar4 = SOIL_internal_create_OGL_texture
                      (psVar5,local_3c,local_38,width,uVar3,flags,0x8513,0x8519,0x851c);
    free(psVar5);
  }
  if (uVar4 == 0) {
    return 0;
  }
  psVar5 = stbi_load(z_neg_file,&local_3c,&local_38,&width,force_channels);
  if (psVar5 == (stbi_uc *)0x0) {
    result_string_pointer = stbi_failure_reason();
  }
  else {
    result_string_pointer = "Image loaded";
  }
  if (uVar2 < 4) {
    width = force_channels;
  }
  if (psVar5 == (stbi_uc *)0x0) {
    result_string_pointer = stbi_failure_reason();
    return 0;
  }
  uVar2 = SOIL_internal_create_OGL_texture
                    (psVar5,local_3c,local_38,width,uVar4,flags,0x8513,0x851a,0x851c);
  free(psVar5);
  return uVar2;
}

Assistant:

unsigned int
	SOIL_load_OGL_cubemap
	(
		const char *x_pos_file,
		const char *x_neg_file,
		const char *y_pos_file,
		const char *y_neg_file,
		const char *z_pos_file,
		const char *z_neg_file,
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels;
	unsigned int tex_id;
	/*	error checking	*/
	if( (x_pos_file == NULL) ||
		(x_neg_file == NULL) ||
		(y_pos_file == NULL) ||
		(y_neg_file == NULL) ||
		(z_pos_file == NULL) ||
		(z_neg_file == NULL) )
	{
		result_string_pointer = "Invalid cube map files list";
		return 0;
	}
	/*	capability checking	*/
	if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
	{
		result_string_pointer = "No cube map capability present";
		return 0;
	}
	/*	1st face: try to load the image	*/
	img = SOIL_load_image( x_pos_file, &width, &height, &channels, force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	upload the texture, and create a texture ID if necessary	*/
	tex_id = SOIL_internal_create_OGL_texture(
			img, width, height, channels,
			reuse_texture_ID, flags,
			SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_X,
			SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
	/*	and nuke the image data	*/
	SOIL_free_image_data( img );
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( x_neg_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( y_pos_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( y_neg_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( z_pos_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_Z,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( z_neg_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	and return the handle, such as it is	*/
	return tex_id;
}